

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O1

void __thiscall
matchit::impl::IdBlockBase<mathiu::impl::List>::reset
          (IdBlockBase<mathiu::impl::List> *this,int32_t depth)

{
  _Variadic_union<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>
  local_38;
  undefined8 uStack_20;
  
  if (depth <= this->mDepth) {
    local_38._16_8_ = 0;
    uStack_20 = 0;
    local_38._M_rest._M_rest =
         (_Variadic_union<mathiu::impl::List_*,_const_mathiu::impl::List_*>)0x0;
    local_38._8_8_ = 0;
    if (*(__index_type *)
         ((long)&(this->mVariant).
                 super__Variant_base<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>
                 .
                 super__Move_assign_alias<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>
                 .
                 super__Copy_assign_alias<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>
                 .
                 super__Move_ctor_alias<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>
                 .
                 super__Copy_ctor_alias<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>
                 .
                 super__Variant_storage_alias<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>
         + 0x18) != '\0') {
      std::variant<std::monostate,mathiu::impl::List,mathiu::impl::List*,mathiu::impl::List_const*>
      ::emplace<0ul,std::monostate>
                ((variant<std::monostate,mathiu::impl::List,mathiu::impl::List*,mathiu::impl::List_const*>
                  *)&this->mVariant,(monostate *)&local_38);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>
                         *)&local_38);
    this->mDepth = depth;
  }
  return;
}

Assistant:

constexpr void reset(int32_t depth)
            {
                if (mDepth - depth >= 0)
                {
                    mVariant = {};
                    mDepth = depth;
                }
            }